

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O2

bool __thiscall cursespp::ListWindow::KeyPress(ListWindow *this,string *key)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  size_t sVar3;
  
  bVar1 = std::operator==(key,"KEY_ENTER");
  if (bVar1) {
    iVar2 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
              _vptr_IOrderable[0x45])(this);
    sVar3 = CONCAT44(extraout_var,iVar2);
    if (sVar3 != NO_SELECTION) {
      UNRECOVERED_JUMPTABLE =
           (this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
           _vptr_IOrderable[0x49];
      uVar4 = extraout_RDX;
LAB_00189758:
      iVar2 = (*UNRECOVERED_JUMPTABLE)(this,sVar3,uVar4,UNRECOVERED_JUMPTABLE);
      return SUB41(iVar2,0);
    }
  }
  else {
    bVar1 = std::operator==(key,"M-enter");
    if (bVar1) {
      iVar2 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
                _vptr_IOrderable[0x45])(this);
      sVar3 = CONCAT44(extraout_var_00,iVar2);
      if (sVar3 != NO_SELECTION) {
        UNRECOVERED_JUMPTABLE =
             (this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
             _vptr_IOrderable[0x4a];
        uVar4 = extraout_RDX_00;
        goto LAB_00189758;
      }
    }
  }
  bVar1 = ScrollableWindow::KeyPress(&this->super_ScrollableWindow,key);
  return bVar1;
}

Assistant:

bool ListWindow::KeyPress(const std::string& key) {
    if (key == "KEY_ENTER") {
        auto selected = this->GetSelectedIndex();
        if (selected != NO_SELECTION) {
            return this->OnEntryActivated(selected);
        }
    }
    else if (key == "M-enter") {
        auto selected = this->GetSelectedIndex();
        if (selected != NO_SELECTION) {
            return this->OnEntryContextMenu(selected);
        }
    }
    return ScrollableWindow::KeyPress(key);
}